

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O2

void __thiscall cmUVReadOnlyProcess::UVTryFinish(cmUVReadOnlyProcess *this)

{
  uv_process_s *puVar1;
  uv_pipe_s *puVar2;
  
  puVar1 = ::cm::uv_handle_ptr_base_<uv_process_s>::get
                     ((uv_handle_ptr_base_<uv_process_s> *)&this->UVProcess_);
  if (puVar1 == (uv_process_s *)0x0) {
    puVar2 = ::cm::uv_handle_ptr_base_<uv_pipe_s>::get
                       ((uv_handle_ptr_base_<uv_pipe_s> *)&this->UVPipeOut_);
    if (puVar2 == (uv_pipe_s *)0x0) {
      puVar2 = ::cm::uv_handle_ptr_base_<uv_pipe_s>::get
                         ((uv_handle_ptr_base_<uv_pipe_s> *)&this->UVPipeErr_);
      if (puVar2 == (uv_pipe_s *)0x0) {
        this->IsFinished_ = true;
        std::function<void_()>::operator()(&this->FinishedCallback_);
        return;
      }
    }
  }
  return;
}

Assistant:

void cmUVReadOnlyProcess::UVTryFinish()
{
  // There still might be data in the pipes after the process has finished.
  // Therefore check if the process is finished AND all pipes are closed
  // before signaling the worker thread to continue.
  if ((UVProcess_.get() != nullptr) || (UVPipeOut_.uv_pipe() != nullptr) ||
      (UVPipeErr_.uv_pipe() != nullptr)) {
    return;
  }
  IsFinished_ = true;
  FinishedCallback_();
}